

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t_func.cpp
# Opt level: O0

int FS_CheckInventory(AActor *activator,char *type)

{
  int iVar1;
  PClassActor *type_00;
  AInventory *pAVar2;
  int local_34;
  AInventory *item;
  PClassActor *info;
  char *type_local;
  AActor *activator_local;
  
  if (activator == (AActor *)0x0) {
    activator_local._4_4_ = 0;
  }
  else {
    iVar1 = strcmp(type,"Armor");
    if (iVar1 == 0) {
      info = (PClassActor *)0xa425e0;
    }
    else {
      iVar1 = strcmp(type,"Health");
      info = (PClassActor *)type;
      if (iVar1 == 0) {
        return activator->health;
      }
    }
    type_00 = PClass::FindActor((char *)info);
    pAVar2 = AActor::FindInventory(activator,type_00,false);
    if (pAVar2 == (AInventory *)0x0) {
      local_34 = 0;
    }
    else {
      local_34 = pAVar2->Amount;
    }
    activator_local._4_4_ = local_34;
  }
  return activator_local._4_4_;
}

Assistant:

static int FS_CheckInventory (AActor *activator, const char *type)
{
	if (activator == NULL)
		return 0;

	if (strcmp (type, "Armor") == 0)
	{
		type = "BasicArmor";
	}
	else if (strcmp (type, "Health") == 0)
	{
		return activator->health;
	}

	PClassActor *info = PClass::FindActor (type);
	AInventory *item = activator->FindInventory (info);
	return item ? item->Amount : 0;
}